

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

void gflags::anon_unknown_2::RegisterCommandLineFlag
               (char *name,char *help,char *filename,FlagValue *current,FlagValue *defvalue)

{
  Mutex *pMVar1;
  size_t *psVar2;
  _Rb_tree_header *p_Var3;
  ulong uVar4;
  undefined1 auVar5 [16];
  _Rb_tree_node_base *p_Var6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  _Base_ptr p_Var10;
  FlagRegistry *pFVar11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  char *pcVar17;
  bool bVar18;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar19;
  
  p_Var16 = (_Base_ptr)0x151530;
  if (help != (char *)0x0) {
    p_Var16 = (_Base_ptr)help;
  }
  p_Var10 = (_Base_ptr)operator_new(0x38);
  *(char **)p_Var10 = name;
  p_Var10->_M_parent = p_Var16;
  p_Var10->_M_left = (_Base_ptr)filename;
  *(undefined1 *)&p_Var10->_M_right = 0;
  *(FlagValue **)(p_Var10 + 1) = defvalue;
  p_Var10[1]._M_parent = (_Base_ptr)current;
  p_Var10[1]._M_left = (_Base_ptr)0x0;
  pFVar11 = FlagRegistry::GlobalRegistry();
  pMVar1 = &pFVar11->lock_;
  iVar9 = pMVar1->mutex_;
  pMVar1->mutex_ = pMVar1->mutex_ + -1;
  if (iVar9 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  pcVar17 = *(char **)p_Var10;
  p_Var12 = (_Rb_tree_node_base *)operator_new(0x30);
  *(char **)(p_Var12 + 1) = pcVar17;
  p_Var12[1]._M_parent = p_Var10;
  p_Var3 = &(pFVar11->flags_)._M_t._M_impl.super__Rb_tree_header;
  p_Var16 = (pFVar11->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var16 == (_Base_ptr)0x0) {
    bVar7 = 1;
    p_Var15 = &p_Var3->_M_header;
  }
  else {
    do {
      p_Var15 = p_Var16;
      uVar8 = strcmp(pcVar17,*(char **)(p_Var15 + 1));
      p_Var16 = (&p_Var15->_M_left)[~uVar8 >> 0x1f];
    } while (p_Var16 != (_Base_ptr)0x0);
    bVar7 = (byte)(uVar8 >> 0x1f);
  }
  p_Var13 = p_Var15;
  if (bVar7 == 0) {
LAB_0013bc34:
    iVar9 = strcmp(*(char **)(p_Var13 + 1),pcVar17);
    if (-1 < iVar9) {
      p_Var16 = p_Var13;
      p_Var15 = (_Rb_tree_node_base *)0x0;
    }
  }
  else if (p_Var15 != (pFVar11->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var15);
    goto LAB_0013bc34;
  }
  if (p_Var15 == (_Rb_tree_node_base *)0x0) {
    operator_delete(p_Var12);
  }
  else {
    bVar18 = true;
    if ((p_Var16 == (_Base_ptr)0x0) && (p_Var3 != (_Rb_tree_header *)p_Var15)) {
      iVar9 = strcmp(pcVar17,*(char **)(p_Var15 + 1));
      bVar18 = SUB41((uint)iVar9 >> 0x1f,0);
    }
    std::_Rb_tree_insert_and_rebalance(bVar18,p_Var12,p_Var15,&p_Var3->_M_header);
    psVar2 = &(pFVar11->flags_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
    p_Var16 = p_Var12;
  }
  if (p_Var15 == (_Rb_tree_node_base *)0x0) {
    p_Var16 = (p_Var16[1]._M_parent)->_M_left;
    p_Var14 = p_Var10->_M_left;
    iVar9 = strcmp((char *)p_Var16,(char *)p_Var14);
    if (iVar9 == 0) {
      pcVar17 = 
      "ERROR: something wrong with flag \'%s\' in file \'%s\'.  One possibility: file \'%s\' is being linked both statically and dynamically into this executable.\n"
      ;
      p_Var16 = p_Var14;
    }
    else {
      pcVar17 = "ERROR: flag \'%s\' was defined more than once (in files \'%s\' and \'%s\').\n";
    }
    ReportError(DIE,pcVar17,*(undefined8 *)p_Var10,p_Var16,p_Var14);
  }
  p_Var16 = p_Var10[1]._M_parent;
  p_Var14 = (pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &(pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = &p_Var3->_M_header;
  if (p_Var14 != (_Base_ptr)0x0) {
    do {
      if (*(ulong *)(p_Var14 + 1) >= *(ulong *)p_Var16) {
        p_Var12 = p_Var14;
      }
      p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < *(ulong *)p_Var16];
    } while (p_Var14 != (_Base_ptr)0x0);
  }
  if (((_Rb_tree_header *)p_Var12 != p_Var3) && (*(ulong *)(p_Var12 + 1) <= *(ulong *)p_Var16))
  goto LAB_0013be0f;
  p_Var15 = (_Rb_tree_node_base *)operator_new(0x30);
  uVar4 = *(ulong *)p_Var16;
  *(ulong *)(p_Var15 + 1) = uVar4;
  p_Var15[1]._M_parent = (_Base_ptr)0x0;
  if ((_Rb_tree_header *)p_Var12 == p_Var3) {
    if (((pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (p_Var16 = (pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
       uVar4 <= *(ulong *)(p_Var16 + 1))) {
LAB_0013bdbf:
      pVar19 = std::
               _Rb_tree<const_void_*,_std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
               ::_M_get_insert_unique_pos(&(pFVar11->flags_by_ptr_)._M_t,(key_type *)(p_Var15 + 1));
    }
    else {
LAB_0013bdad:
      auVar5._8_8_ = 0;
      auVar5._0_8_ = p_Var16;
      pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
    }
  }
  else if (uVar4 < *(ulong *)(p_Var12 + 1)) {
    p_Var16 = (pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pVar19.second = p_Var16;
    pVar19.first = p_Var16;
    if (p_Var16 != p_Var12) {
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var12);
      if (uVar4 <= *(ulong *)(p_Var13 + 1)) goto LAB_0013bdbf;
      p_Var6 = p_Var12;
      if (p_Var13->_M_right == (_Base_ptr)0x0) {
        p_Var12 = p_Var13;
        p_Var6 = (_Rb_tree_node_base *)0x0;
      }
      pVar19.second = p_Var12;
      pVar19.first = p_Var6;
    }
  }
  else if (*(ulong *)(p_Var12 + 1) < uVar4) {
    p_Var16 = (pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if (p_Var16 == p_Var12) goto LAB_0013bdad;
    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    if (*(ulong *)(p_Var13 + 1) <= uVar4) goto LAB_0013bdbf;
    p_Var6 = p_Var13;
    if (p_Var12->_M_right == (_Base_ptr)0x0) {
      p_Var13 = p_Var12;
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    pVar19.second = p_Var13;
    pVar19.first = p_Var6;
  }
  else {
    pVar19.second = (_Rb_tree_node_base *)0x0;
    pVar19.first = p_Var12;
  }
  p_Var13 = pVar19.second;
  p_Var12 = pVar19.first;
  if (p_Var13 == (_Rb_tree_node_base *)0x0) {
    operator_delete(p_Var15);
  }
  else {
    bVar18 = true;
    if ((p_Var12 == (_Rb_tree_node_base *)0x0) && (p_Var3 != (_Rb_tree_header *)p_Var13)) {
      bVar18 = uVar4 < *(ulong *)(p_Var13 + 1);
    }
    std::_Rb_tree_insert_and_rebalance(bVar18,p_Var15,p_Var13,&p_Var3->_M_header);
    psVar2 = &(pFVar11->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
    p_Var12 = p_Var15;
  }
LAB_0013be0f:
  p_Var12[1]._M_parent = p_Var10;
  pMVar1 = &pFVar11->lock_;
  pMVar1->mutex_ = pMVar1->mutex_ + 1;
  if (pMVar1->mutex_ == 0) {
    return;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
}

Assistant:

void RegisterCommandLineFlag(const char* name,
                             const char* help,
                             const char* filename,
                             FlagValue* current,
                             FlagValue* defvalue) {
  if (help == NULL)
    help = "";
  // Importantly, flag_ will never be deleted, so storage is always good.
  CommandLineFlag* flag =
      new CommandLineFlag(name, help, filename, current, defvalue);
  FlagRegistry::GlobalRegistry()->RegisterFlag(flag);  // default registry
}